

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_block_error_intrin_sse2.c
# Opt level: O2

int64_t av1_highbd_block_error_sse2
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bps)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ulong uVar4;
  tran_low_t *ptVar5;
  int unaff_EBP;
  byte bVar6;
  long lVar7;
  tran_low_t *ptVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  lVar7 = 0;
  lVar2 = 0;
  ptVar5 = dqcoeff;
  ptVar8 = coeff;
  for (lVar3 = 0; lVar3 < block_size; lVar3 = lVar3 + 8) {
    auVar11 = *(undefined1 (*) [16])(coeff + lVar3);
    auVar12 = *(undefined1 (*) [16])(coeff + lVar3 + 4);
    auVar13 = *(undefined1 (*) [16])(dqcoeff + lVar3);
    auVar1 = *(undefined1 (*) [16])(dqcoeff + lVar3 + 4);
    auVar14._0_4_ = -(uint)((int)(auVar11._0_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar14._4_4_ = -(uint)((int)(auVar11._4_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar14._8_4_ = -(uint)((int)(auVar11._8_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar14._12_4_ = -(uint)((int)(auVar11._12_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar16._0_4_ = -(uint)((int)(auVar12._0_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar16._4_4_ = -(uint)((int)(auVar12._4_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar16._8_4_ = -(uint)((int)(auVar12._8_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar16._12_4_ = -(uint)((int)(auVar12._12_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar15._0_4_ = -(uint)((int)(auVar13._0_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar15._4_4_ = -(uint)((int)(auVar13._4_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar15._8_4_ = -(uint)((int)(auVar13._8_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar15._12_4_ = -(uint)((int)(auVar13._12_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar17._0_4_ = -(uint)((int)(auVar1._0_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar17._4_4_ = -(uint)((int)(auVar1._4_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar17._8_4_ = -(uint)((int)(auVar1._8_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    auVar17._12_4_ = -(uint)((int)(auVar1._12_4_ - 0x4000U ^ 0x80000000) < 0x7fff8000);
    unaff_EBP = movmskps(unaff_EBP,auVar17 | auVar15 | auVar16 | auVar14);
    if (unaff_EBP == 0) {
      auVar11 = packssdw(auVar11,auVar12);
      auVar12 = packssdw(auVar13,auVar1);
      auVar13._0_2_ = auVar11._0_2_ - auVar12._0_2_;
      auVar13._2_2_ = auVar11._2_2_ - auVar12._2_2_;
      auVar13._4_2_ = auVar11._4_2_ - auVar12._4_2_;
      auVar13._6_2_ = auVar11._6_2_ - auVar12._6_2_;
      auVar13._8_2_ = auVar11._8_2_ - auVar12._8_2_;
      auVar13._10_2_ = auVar11._10_2_ - auVar12._10_2_;
      auVar13._12_2_ = auVar11._12_2_ - auVar12._12_2_;
      auVar13._14_2_ = auVar11._14_2_ - auVar12._14_2_;
      auVar12 = pmaddwd(auVar13,auVar13);
      auVar11 = pmaddwd(auVar11,auVar11);
      lVar2 = lVar2 + (ulong)auVar12._4_4_ + (ulong)auVar12._12_4_ +
                      (auVar12._0_8_ & 0xffffffff) + (ulong)auVar12._8_4_;
      lVar7 = lVar7 + (ulong)(uint)(auVar11._12_4_ + auVar11._4_4_ + auVar11._8_4_ + auVar11._0_4_);
    }
    else {
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        lVar10 = (long)ptVar8[lVar9];
        lVar2 = lVar2 + (lVar10 - ptVar5[lVar9]) * (lVar10 - ptVar5[lVar9]);
        lVar7 = lVar7 + lVar10 * lVar10;
      }
    }
    ptVar5 = ptVar5 + 8;
    ptVar8 = ptVar8 + 8;
  }
  bVar6 = (char)bps * '\x02' - 0x10;
  uVar4 = (ulong)((uint)(1 << (bVar6 & 0x1f)) >> 1);
  *ssz = (long)(lVar7 + uVar4) >> (bVar6 & 0x3f);
  return (long)(lVar2 + uVar4) >> (bVar6 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_sse2(const tran_low_t *coeff,
                                    const tran_low_t *dqcoeff,
                                    intptr_t block_size, int64_t *ssz,
                                    int bps) {
  int i, j, test;
  uint32_t temp[4];
  __m128i max, min, cmp0, cmp1, cmp2, cmp3;
  int64_t error = 0, sqcoeff = 0;
  const int shift = 2 * (bps - 8);
  const int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i += 8) {
    // Load the data into xmm registers
    __m128i mm_coeff = _mm_load_si128((__m128i *)(coeff + i));
    __m128i mm_coeff2 = _mm_load_si128((__m128i *)(coeff + i + 4));
    __m128i mm_dqcoeff = _mm_load_si128((__m128i *)(dqcoeff + i));
    __m128i mm_dqcoeff2 = _mm_load_si128((__m128i *)(dqcoeff + i + 4));
    // Check if any values require more than 15 bit
    max = _mm_set1_epi32(0x3fff);
    min = _mm_set1_epi32((int)0xffffc000);
    cmp0 = _mm_xor_si128(_mm_cmpgt_epi32(mm_coeff, max),
                         _mm_cmplt_epi32(mm_coeff, min));
    cmp1 = _mm_xor_si128(_mm_cmpgt_epi32(mm_coeff2, max),
                         _mm_cmplt_epi32(mm_coeff2, min));
    cmp2 = _mm_xor_si128(_mm_cmpgt_epi32(mm_dqcoeff, max),
                         _mm_cmplt_epi32(mm_dqcoeff, min));
    cmp3 = _mm_xor_si128(_mm_cmpgt_epi32(mm_dqcoeff2, max),
                         _mm_cmplt_epi32(mm_dqcoeff2, min));
    test = _mm_movemask_epi8(
        _mm_or_si128(_mm_or_si128(cmp0, cmp1), _mm_or_si128(cmp2, cmp3)));

    if (!test) {
      __m128i mm_diff, error_sse2, sqcoeff_sse2;
      mm_coeff = _mm_packs_epi32(mm_coeff, mm_coeff2);
      mm_dqcoeff = _mm_packs_epi32(mm_dqcoeff, mm_dqcoeff2);
      mm_diff = _mm_sub_epi16(mm_coeff, mm_dqcoeff);
      error_sse2 = _mm_madd_epi16(mm_diff, mm_diff);
      sqcoeff_sse2 = _mm_madd_epi16(mm_coeff, mm_coeff);
      _mm_storeu_si128((__m128i *)temp, error_sse2);
      error = error + temp[0] + temp[1] + temp[2] + temp[3];
      _mm_storeu_si128((__m128i *)temp, sqcoeff_sse2);
      sqcoeff += temp[0] + temp[1] + temp[2] + temp[3];
    } else {
      for (j = 0; j < 8; j++) {
        const int64_t diff = coeff[i + j] - dqcoeff[i + j];
        error += diff * diff;
        sqcoeff += (int64_t)coeff[i + j] * (int64_t)coeff[i + j];
      }
    }
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}